

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_phase_callback_registry.cpp
# Opt level: O2

void __thiscall
sc_core::sc_phase_callback_registry::do_callback(sc_phase_callback_registry *this,sc_status s)

{
  pointer peVar1;
  pointer peVar2;
  hierarchy_scope scope;
  hierarchy_scope hStack_28;
  
  peVar1 = (this->m_cb_vec).
           super__Vector_base<sc_core::sc_phase_callback_registry::entry,_std::allocator<sc_core::sc_phase_callback_registry::entry>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (peVar2 = (this->m_cb_vec).
                super__Vector_base<sc_core::sc_phase_callback_registry::entry,_std::allocator<sc_core::sc_phase_callback_registry::entry>_>
                ._M_impl.super__Vector_impl_data._M_start; peVar2 != peVar1; peVar2 = peVar2 + 1) {
    if ((peVar2->mask & s) != SC_UNITIALIZED) {
      sc_object::hierarchy_scope::hierarchy_scope(&hStack_28,peVar2->target);
      (*peVar2->target->_vptr_sc_object[0xc])();
      sc_object::hierarchy_scope::~hierarchy_scope(&hStack_28);
    }
  }
  return;
}

Assistant:

void
sc_phase_callback_registry::do_callback( sc_status s ) const
{
    typedef storage_type::const_iterator it_type;
    storage_type const & vec = m_cb_vec;

    for(it_type it = vec.begin(), end = vec.end(); it != end; ++it) {
        if( s & it->mask ) {
            sc_object::hierarchy_scope scope(it->target);
            it->target->do_simulation_phase_callback();
        }
    }
}